

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

string_view __thiscall wasm::WasmBinaryReader::getByteView(WasmBinaryReader *this,size_t size)

{
  ulong uVar1;
  size_type sVar2;
  char *pcVar3;
  allocator<char> local_49;
  string local_48;
  size_t local_28;
  size_t size_local;
  WasmBinaryReader *this_local;
  
  local_28 = size;
  size_local = (size_t)this;
  sVar2 = std::vector<char,_std::allocator<char>_>::size(this->input);
  if (size <= sVar2) {
    uVar1 = this->pos;
    sVar2 = std::vector<char,_std::allocator<char>_>::size(this->input);
    if (uVar1 <= sVar2 - local_28) {
      this->pos = this->pos + local_28;
      pcVar3 = std::vector<char,_std::allocator<char>_>::data(this->input);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                 pcVar3 + (this->pos - local_28),local_28);
      return _this_local;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"unexpected end of input",&local_49);
  throwError(this,&local_48);
}

Assistant:

std::string_view WasmBinaryReader::getByteView(size_t size) {
  if (size > input.size() || pos > input.size() - size) {
    throwError("unexpected end of input");
  }
  pos += size;
  return {input.data() + (pos - size), size};
}